

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_vtk.cpp
# Opt level: O3

path * __thiscall
Omega_h::vtk::piece_filename(path *__return_storage_ptr__,vtk *this,path *piecepath,I32 rank)

{
  uint uVar1;
  path *ppVar2;
  uint uVar3;
  ulong uVar4;
  uint __val;
  uint __len;
  string __str;
  string local_50;
  
  (__return_storage_ptr__->impl)._M_dataplus._M_p = (pointer)&(__return_storage_ptr__->impl).field_2
  ;
  std::__cxx11::string::_M_construct<char*>
            ((string *)__return_storage_ptr__,this,this + (long)&piecepath->impl);
  filesystem::path::operator+=(__return_storage_ptr__,'_');
  __val = -rank;
  if (0 < rank) {
    __val = rank;
  }
  __len = 1;
  if (9 < __val) {
    uVar4 = (ulong)__val;
    uVar1 = 4;
    do {
      __len = uVar1;
      uVar3 = (uint)uVar4;
      if (uVar3 < 100) {
        __len = __len - 2;
        goto LAB_0041d866;
      }
      if (uVar3 < 1000) {
        __len = __len - 1;
        goto LAB_0041d866;
      }
      if (uVar3 < 10000) goto LAB_0041d866;
      uVar4 = uVar4 / 10000;
      uVar1 = __len + 4;
    } while (99999 < uVar3);
    __len = __len + 1;
  }
LAB_0041d866:
  local_50._M_dataplus._M_p = (pointer)&local_50.field_2;
  std::__cxx11::string::_M_construct((ulong)&local_50,(char)__len - (char)(rank >> 0x1f));
  std::__detail::__to_chars_10_impl<unsigned_int>
            (local_50._M_dataplus._M_p + ((uint)rank >> 0x1f),__len,__val);
  filesystem::path::operator+=(__return_storage_ptr__,&local_50);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  ppVar2 = filesystem::path::operator+=(__return_storage_ptr__,".vtu");
  return ppVar2;
}

Assistant:

static filesystem::path piece_filename(
    filesystem::path const& piecepath, I32 rank) {
  auto piece_filename = piecepath;
  piece_filename += '_';
  piece_filename += std::to_string(rank);
  piece_filename += ".vtu";
  return piece_filename;
}